

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O1

char * Saig_ObjName(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char *__format;
  
  uVar5 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar2 = uVar5 & 7;
  if (uVar2 - 7 < 0xfffffffe) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar5 = uVar5 & 7;
    if (uVar5 != 1) {
      if ((uVar5 == 2) && ((pObj->field_0).CioId < p->nTruePis)) {
        uVar2 = p->nTruePis;
        if (uVar2 < 2) {
          uVar7 = (ulong)uVar2;
        }
        else {
          uVar7 = 0;
          uVar2 = uVar2 - 1;
          if (uVar2 != 0) {
            do {
              uVar7 = (ulong)((int)uVar7 + 1);
              bVar1 = 9 < uVar2;
              uVar2 = uVar2 / 10;
            } while (bVar1);
          }
        }
        uVar6 = (ulong)(uint)(pObj->field_0).CioId;
        __format = "pi%0*d";
      }
      else if ((uVar5 == 3) && ((pObj->field_0).CioId < p->nTruePos)) {
        uVar5 = p->nTruePos;
        if (uVar5 < 2) {
          uVar7 = (ulong)uVar5;
        }
        else {
          uVar7 = 0;
          uVar5 = uVar5 - 1;
          if (uVar5 != 0) {
            do {
              uVar7 = (ulong)((int)uVar7 + 1);
              bVar1 = 9 < uVar5;
              uVar5 = uVar5 / 10;
            } while (bVar1);
          }
        }
        if (4 < uVar2) {
          __assert_fail("!Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
        }
        uVar6 = (ulong)(uint)(pObj->field_0).CioId;
        __format = "po%0*d";
      }
      else {
        if ((uVar5 == 2) && (p->nTruePis <= (pObj->field_0).CioId)) {
          uVar2 = p->nRegs;
          if (1 < uVar2) {
            uVar5 = 0;
            uVar3 = uVar2 - 1;
            uVar2 = uVar5;
            if (uVar3 != 0) {
              do {
                uVar2 = uVar5 + 1;
                bVar1 = 9 < uVar3;
                uVar5 = uVar2;
                uVar3 = uVar3 / 10;
              } while (bVar1);
            }
          }
          iVar4 = Aig_ObjCioId(pObj);
          uVar5 = iVar4 - p->nTruePis;
          __format = "lo%0*d";
        }
        else {
          if ((uVar5 != 3) || ((pObj->field_0).CioId < p->nTruePos)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIoa.c"
                          ,0x3c,"char *Saig_ObjName(Aig_Man_t *, Aig_Obj_t *)");
          }
          uVar2 = p->nRegs;
          if (1 < uVar2) {
            uVar5 = 0;
            uVar3 = uVar2 - 1;
            uVar2 = uVar5;
            if (uVar3 != 0) {
              do {
                uVar2 = uVar5 + 1;
                bVar1 = 9 < uVar3;
                uVar5 = uVar2;
                uVar3 = uVar3 / 10;
              } while (bVar1);
            }
          }
          iVar4 = Aig_ObjCioId(pObj);
          uVar5 = iVar4 - p->nTruePos;
          __format = "li%0*d";
        }
        uVar7 = (ulong)uVar2;
        uVar6 = (ulong)uVar5;
      }
      goto LAB_006e0af5;
    }
  }
  uVar2 = p->vObjs->nSize;
  if (uVar2 < 2) {
    uVar7 = (ulong)uVar2;
  }
  else {
    uVar7 = 0;
    uVar2 = uVar2 - 1;
    if (uVar2 != 0) {
      do {
        uVar7 = (ulong)((int)uVar7 + 1);
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
  }
  uVar6 = (ulong)(uint)pObj->Id;
  __format = "n%0*d";
LAB_006e0af5:
  sprintf(Saig_ObjName::Buffer,__format,uVar7,uVar6);
  return Saig_ObjName::Buffer;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Saig_ObjName( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    static char Buffer[16];
    if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
        sprintf( Buffer, "n%0*d", Abc_Base10Log(Aig_ManObjNumMax(p)), Aig_ObjId(pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        sprintf( Buffer, "pi%0*d", Abc_Base10Log(Saig_ManPiNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsPo(p, pObj) )
        sprintf( Buffer, "po%0*d", Abc_Base10Log(Saig_ManPoNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsLo(p, pObj) )
        sprintf( Buffer, "lo%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPiNum(p) );
    else if ( Saig_ObjIsLi(p, pObj) )
        sprintf( Buffer, "li%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPoNum(p) );
    else 
        assert( 0 );
    return Buffer;
}